

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hu_scores.cpp
# Opt level: O3

int compareteams(void *arg1,void *arg2)

{
  long lVar1;
  long lVar2;
  undefined8 *puVar3;
  int iVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  uint uVar7;
  uint uVar8;
  
  lVar1 = *arg1;
  lVar2 = *arg2;
  uVar7 = *(int *)(lVar1 + 0x48) + 0x1ff;
  puVar3 = (undefined8 *)(*(long *)(lVar1 + 0x38) + (ulong)(uVar7 & 0x1e5) * 0x18);
  do {
    puVar5 = puVar3;
    puVar3 = (undefined8 *)*puVar5;
  } while (*(int *)(puVar5 + 1) != 0x1e5);
  uVar8 = *(int *)(lVar2 + 0x48) + 0x1ff;
  puVar3 = (undefined8 *)(*(long *)(lVar2 + 0x38) + (ulong)(uVar8 & 0x1e5) * 0x18);
  do {
    puVar6 = puVar3;
    puVar3 = (undefined8 *)*puVar6;
  } while (*(int *)(puVar6 + 1) != 0x1e5);
  iVar4 = *(int *)(puVar5[2] + 0x28) - *(int *)(puVar6[2] + 0x28);
  if ((iVar4 == 0) && (iVar4 = *(int *)(lVar2 + 0xc4) - *(int *)(lVar1 + 0xc4), iVar4 == 0)) {
    puVar3 = (undefined8 *)(*(long *)(lVar1 + 0x38) + (ulong)(uVar7 & 0x1cf) * 0x18);
    do {
      puVar5 = puVar3;
      puVar3 = (undefined8 *)*puVar5;
    } while (*(int *)(puVar5 + 1) != 0x1cf);
    puVar3 = (undefined8 *)(*(long *)(lVar2 + 0x38) + (ulong)(uVar8 & 0x1cf) * 0x18);
    do {
      puVar6 = puVar3;
      puVar3 = (undefined8 *)*puVar6;
    } while (*(int *)(puVar6 + 1) != 0x1cf);
    iVar4 = strcasecmp(*(char **)(puVar5[2] + 0x28),*(char **)(puVar6[2] + 0x28));
    return iVar4;
  }
  return iVar4;
}

Assistant:

int compareteams (const void *arg1, const void *arg2)
{
	// Compare first by teams, then by frags, then by name.
	player_t *p1 = *(player_t **)arg1;
	player_t *p2 = *(player_t **)arg2;
	int diff;

	diff = p1->userinfo.GetTeam() - p2->userinfo.GetTeam();
	if (diff == 0)
	{
		diff = p2->fragcount - p1->fragcount;
		if (diff == 0)
		{
			diff = stricmp (p1->userinfo.GetName(), p2->userinfo.GetName());
		}
	}
	return diff;
}